

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

ssize_t __thiscall
libchars::terminal_driver::read(terminal_driver *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  size_t rbuf_mask;
  uint64_t t_msec_now;
  timeval T_now;
  int r;
  uint64_t timeout_ms;
  uint64_t t_msec_start;
  timeval T_start;
  size_t timeout_s_local;
  uint8_t *c_local;
  terminal_driver *this_local;
  
  if (this->rbuf_deq < this->rbuf_enq) {
LAB_0013a93b:
    *(uint8_t *)CONCAT44(in_register_00000034,__fd) =
         this->rbuf[this->rbuf_deq & this->rbuf_size - 1];
    this->rbuf_deq = this->rbuf_deq + 1;
    this_local._4_4_ = 1;
  }
  else {
    T_start.tv_usec = (__suseconds_t)__buf;
    gettimeofday((timeval *)&t_msec_start,(__timezone_ptr_t)0x0);
    lVar2 = T_start.tv_usec * 1000;
    do {
      do {
        if (this->rbuf_deq < this->rbuf_enq) goto LAB_0013a93b;
        T_now.tv_usec._4_4_ = read_characters(this,false);
        this_local._4_4_ = T_now.tv_usec._4_4_;
        if ((int)T_now.tv_usec._4_4_ < 0) goto LAB_0013a982;
      } while (T_now.tv_usec._4_4_ != 0);
      if (T_start.tv_usec == 0) goto LAB_0013a982;
      iVar1 = gettimeofday((timeval *)&t_msec_now,(__timezone_ptr_t)0x0);
      if (iVar1 != 0) {
        this_local._4_4_ = T_now.tv_usec._4_4_;
        goto LAB_0013a982;
      }
    } while (t_msec_now * 1000 + (ulong)T_now.tv_sec / 1000 <
             t_msec_start * 1000 + (ulong)T_start.tv_sec / 1000 + lVar2);
    this_local._4_4_ = 0xfffffffd;
  }
LAB_0013a982:
  return (ulong)this_local._4_4_;
}

Assistant:

int terminal_driver::read(uint8_t &c, size_t timeout_s)
    {
        if (rbuf_enq <= rbuf_deq) {
            struct timeval T_start;
            gettimeofday(&T_start, NULL);
            uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
            uint64_t timeout_ms = timeout_s * 1000UL;

            while (rbuf_enq <= rbuf_deq) {
                int r = read_characters(false);
                if (r < 0)
                    return r;
                else if (r == 0) {
                    if (timeout_s > 0) {
                        struct timeval T_now;
                        if (gettimeofday(&T_now, NULL) == 0) {
                            uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                            if (t_msec_now >= (t_msec_start + timeout_ms))
                                return -3;
                        }
                        else {
                            return r;
                        }
                    }
                    else {
                        return r;
                    }
                }
            }
        }

        size_t rbuf_mask = (rbuf_size - 1);
        c = *(rbuf + (rbuf_deq & rbuf_mask));
        ++rbuf_deq;

        return 1;
    }